

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdGetPsbtTxInIndex(void *handle,void *psbt_handle,char *txid,uint32_t vout,uint32_t *index)

{
  pointer *ppuVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  OutPoint outpoint;
  allocator local_99;
  OutPoint local_98;
  Txid local_70;
  string local_50;
  
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&local_98.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8);
  local_98.txid_._vptr_Txid = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&local_98);
  if (local_98.txid_._vptr_Txid != (_func_int **)ppuVar1) {
    operator_delete(local_98.txid_._vptr_Txid);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    local_98.txid_._vptr_Txid = (_func_int **)0x5e393a;
    local_98.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5d4;
    local_98.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtTxInIndex";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98.txid_._vptr_Txid = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_98);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (index == (uint32_t *)0x0) {
    local_98.txid_._vptr_Txid = (_func_int **)0x5e393a;
    local_98.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5da;
    local_98.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtTxInIndex";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,"index is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98.txid_._vptr_Txid = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Failed to parameter. index is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_98);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&local_50,txid,&local_99);
    cfd::core::Txid::Txid(&local_70,&local_50);
    cfd::core::OutPoint::OutPoint(&local_98,&local_70,vout);
    local_70._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if (local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    uVar3 = cfd::Psbt::GetTxInIndex(*(Psbt **)((long)psbt_handle + 0x18),&local_98);
    *index = uVar3;
    local_98.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if ((void *)CONCAT44(local_98.txid_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_98.txid_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_98.txid_.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_98.txid_.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    return 0;
  }
  local_98.txid_._vptr_Txid = (_func_int **)0x5e393a;
  local_98.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5e0;
  local_98.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtTxInIndex";
  cfd::core::logger::log<>((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,"psbt is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98.txid_._vptr_Txid = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Failed to handle statement. psbt is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_98);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtTxInIndex(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (index == nullptr) {
      warn(CFD_LOG_SOURCE, "index is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. index is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);

    *index = psbt_obj->psbt->GetTxInIndex(outpoint);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}